

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void Translate(ExpressionTranslateContext *ctx,ExprBase *expression)

{
  undefined8 in_RAX;
  FunctionData *pFVar1;
  undefined8 in_RDX;
  ulong uVar2;
  char *format;
  
  do {
    if ((FunctionData *)expression == (FunctionData *)0x0) {
LAB_00143bdd:
      pFVar1 = (FunctionData *)0x0;
    }
    else {
      if (*(uint *)&((FunctionData *)expression)->importModule == 2) {
        Print(ctx,"/*void*/",in_RDX,in_RAX);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 3)) goto LAB_00143bdd;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      TranslateBoolLiteral(ctx,(ExprBoolLiteral *)pFVar1);
      return;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 4)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      uVar2 = (ulong)(uint)(int)*(char *)((long)&pFVar1->type + 1);
      format = "char(%u)";
LAB_00143df2:
      Print(ctx,format,uVar2,in_RAX);
      return;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 5)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      TranslateStringLiteral(ctx,(ExprStringLiteral *)pFVar1);
      return;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 6)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      TranslateIntegerLiteral(ctx,(ExprIntegerLiteral *)pFVar1);
      return;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 7)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      TranslateRationalLiteral(ctx,(ExprRationalLiteral *)pFVar1);
      return;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 8)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      uVar2 = (ulong)*(uint *)&((FunctionData *)pFVar1->contextType)->type;
      format = "__nullcTR[%d]";
      goto LAB_00143df2;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 9)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      TranslateNullptrLiteral(ctx,(ExprNullptrLiteral *)pFVar1);
      return;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 10)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 != (FunctionData *)0x0) {
      uVar2 = (ulong)((FunctionData *)pFVar1->contextType)->functionIndex;
      format = "__nullcFR[%d]";
      goto LAB_00143df2;
    }
    if (((FunctionData *)expression == (FunctionData *)0x0) ||
       (pFVar1 = (FunctionData *)expression,
       *(uint *)&((FunctionData *)expression)->importModule != 0xe)) {
      pFVar1 = (FunctionData *)0x0;
    }
    if (pFVar1 == (FunctionData *)0x0) {
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0xf)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslateArray(ctx,(ExprArray *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x10)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslatePreModify(ctx,(ExprPreModify *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x11)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslatePostModify(ctx,(ExprPostModify *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x12)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslateCast(ctx,(ExprTypeCast *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x13)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslateUnaryOp(ctx,(ExprUnaryOp *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x14)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslateBinaryOp(ctx,(ExprBinaryOp *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x15)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslateGetAddress(ctx,(ExprGetAddress *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x16)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 != (FunctionData *)0x0) {
        TranslateDereference(ctx,(ExprDereference *)pFVar1);
        return;
      }
      if (((FunctionData *)expression == (FunctionData *)0x0) ||
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule != 0x17)) {
        pFVar1 = (FunctionData *)0x0;
      }
      if (pFVar1 == (FunctionData *)0x0) break;
    }
    expression = (ExprBase *)pFVar1->contextType;
  } while( true );
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x18)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateConditional(ctx,(ExprConditional *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x19)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateAssignment(ctx,(ExprAssignment *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x1a)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateMemberAccess(ctx,(ExprMemberAccess *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x1b)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateArrayIndex(ctx,(ExprArrayIndex *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x1c)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateReturn(ctx,(ExprReturn *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x1d)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateYield(ctx,(ExprYield *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x1e)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateVariableDefinition(ctx,(ExprVariableDefinition *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x1f)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateZeroInitialize(ctx,(ExprZeroInitialize *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x20)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateArraySetup(ctx,(ExprArraySetup *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x21)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateVariableDefinitions(ctx,(ExprVariableDefinitions *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x22)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateVariableAccess(ctx,(ExprVariableAccess *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x23)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateFunctionContextAccess(ctx,(ExprFunctionContextAccess *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x24)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateFunctionDefinition(ctx,(ExprFunctionDefinition *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x25)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateGenericFunctionPrototype(ctx,(ExprGenericFunctionPrototype *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x26)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateFunctionAccess(ctx,(ExprFunctionAccess *)pFVar1);
    return;
  }
  if ((FunctionData *)expression != (FunctionData *)0x0) {
    if (*(uint *)&((FunctionData *)expression)->importModule == 0x27) {
      __assert_fail("!\"miscompiled tree\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0xb36,"void Translate(ExpressionTranslateContext &, ExprBase *)");
    }
    if ((FunctionData *)expression != (FunctionData *)0x0) {
      if (*(uint *)&((FunctionData *)expression)->importModule == 0x28) {
        __assert_fail("!\"miscompiled tree\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0xb38,"void Translate(ExpressionTranslateContext &, ExprBase *)");
      }
      if (((FunctionData *)expression != (FunctionData *)0x0) &&
         (pFVar1 = (FunctionData *)expression,
         *(uint *)&((FunctionData *)expression)->importModule == 0x29)) goto LAB_00144041;
    }
  }
  pFVar1 = (FunctionData *)0x0;
LAB_00144041:
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateFunctionCall(ctx,(ExprFunctionCall *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x2a)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateAliasDefinition(ctx,(ExprAliasDefinition *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x2b)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateClassPrototype(ctx,(ExprClassPrototype *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x2c)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateGenericClassPrototype(ctx,(ExprGenericClassPrototype *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x2d)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateClassDefinition(ctx,(ExprClassDefinition *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x2e)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateEnumDefinition(ctx,(ExprEnumDefinition *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x2f)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateIfElse(ctx,(ExprIfElse *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x30)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateFor(ctx,(ExprFor *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x31)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateWhile(ctx,(ExprWhile *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x32)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateDoWhile(ctx,(ExprDoWhile *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x33)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateSwitch(ctx,(ExprSwitch *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x34)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateBreak(ctx,(ExprBreak *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x35)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateContinue(ctx,(ExprContinue *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (pFVar1 = (FunctionData *)expression,
     *(uint *)&((FunctionData *)expression)->importModule != 0x36)) {
    pFVar1 = (FunctionData *)0x0;
  }
  if (pFVar1 != (FunctionData *)0x0) {
    TranslateBlock(ctx,(ExprBlock *)pFVar1);
    return;
  }
  if (((FunctionData *)expression == (FunctionData *)0x0) ||
     (*(uint *)&((FunctionData *)expression)->importModule != 0x37)) {
    expression = (ExprBase *)0x0;
  }
  if ((FunctionData *)expression != (FunctionData *)0x0) {
    TranslateSequence(ctx,(ExprSequence *)expression);
    return;
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                ,0xb58,"void Translate(ExpressionTranslateContext &, ExprBase *)");
}

Assistant:

void Translate(ExpressionTranslateContext &ctx, ExprBase *expression)
{
	if(ExprVoid *expr = getType<ExprVoid>(expression))
		TranslateVoid(ctx, expr);
	else if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(expression))
		TranslateBoolLiteral(ctx, expr);
	else if(ExprCharacterLiteral *expr = getType<ExprCharacterLiteral>(expression))
		TranslateCharacterLiteral(ctx, expr);
	else if(ExprStringLiteral *expr = getType<ExprStringLiteral>(expression))
		TranslateStringLiteral(ctx, expr);
	else if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(expression))
		TranslateIntegerLiteral(ctx, expr);
	else if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(expression))
		TranslateRationalLiteral(ctx, expr);
	else if(ExprTypeLiteral *expr = getType<ExprTypeLiteral>(expression))
		TranslateTypeLiteral(ctx, expr);
	else if(ExprNullptrLiteral *expr = getType<ExprNullptrLiteral>(expression))
		TranslateNullptrLiteral(ctx, expr);
	else if(ExprFunctionIndexLiteral *expr = getType<ExprFunctionIndexLiteral>(expression))
		TranslateFunctionIndexLiteral(ctx, expr);
	else if(ExprPassthrough *expr = getType<ExprPassthrough>(expression))
		TranslatePassthrough(ctx, expr);
	else if(ExprArray *expr = getType<ExprArray>(expression))
		TranslateArray(ctx, expr);
	else if(ExprPreModify *expr = getType<ExprPreModify>(expression))
		TranslatePreModify(ctx, expr);
	else if(ExprPostModify *expr = getType<ExprPostModify>(expression))
		TranslatePostModify(ctx, expr);
	else if(ExprTypeCast *expr = getType<ExprTypeCast>(expression))
		TranslateCast(ctx, expr);
	else if(ExprUnaryOp *expr = getType<ExprUnaryOp>(expression))
		TranslateUnaryOp(ctx, expr);
	else if(ExprBinaryOp *expr = getType<ExprBinaryOp>(expression))
		TranslateBinaryOp(ctx, expr);
	else if(ExprGetAddress *expr = getType<ExprGetAddress>(expression))
		TranslateGetAddress(ctx, expr);
	else if(ExprDereference *expr = getType<ExprDereference>(expression))
		TranslateDereference(ctx, expr);
	else if(ExprUnboxing *expr = getType<ExprUnboxing>(expression))
		TranslateUnboxing(ctx, expr);
	else if(ExprConditional *expr = getType<ExprConditional>(expression))
		TranslateConditional(ctx, expr);
	else if(ExprAssignment *expr = getType<ExprAssignment>(expression))
		TranslateAssignment(ctx, expr);
	else if(ExprMemberAccess *expr = getType<ExprMemberAccess>(expression))
		TranslateMemberAccess(ctx, expr);
	else if(ExprArrayIndex *expr = getType<ExprArrayIndex>(expression))
		TranslateArrayIndex(ctx, expr);
	else if(ExprReturn *expr = getType<ExprReturn>(expression))
		TranslateReturn(ctx, expr);
	else if(ExprYield *expr = getType<ExprYield>(expression))
		TranslateYield(ctx, expr);
	else if(ExprVariableDefinition *expr = getType<ExprVariableDefinition>(expression))
		TranslateVariableDefinition(ctx, expr);
	else if(ExprZeroInitialize *expr = getType<ExprZeroInitialize>(expression))
		TranslateZeroInitialize(ctx, expr);
	else if(ExprArraySetup *expr = getType<ExprArraySetup>(expression))
		TranslateArraySetup(ctx, expr);
	else if(ExprVariableDefinitions *expr = getType<ExprVariableDefinitions>(expression))
		TranslateVariableDefinitions(ctx, expr);
	else if(ExprVariableAccess *expr = getType<ExprVariableAccess>(expression))
		TranslateVariableAccess(ctx, expr);
	else if(ExprFunctionContextAccess *expr = getType<ExprFunctionContextAccess>(expression))
		TranslateFunctionContextAccess(ctx, expr);
	else if(ExprFunctionDefinition *expr = getType<ExprFunctionDefinition>(expression))
		TranslateFunctionDefinition(ctx, expr);
	else if(ExprGenericFunctionPrototype *expr = getType<ExprGenericFunctionPrototype>(expression))
		TranslateGenericFunctionPrototype(ctx, expr);
	else if(ExprFunctionAccess *expr = getType<ExprFunctionAccess>(expression))
		TranslateFunctionAccess(ctx, expr);
	else if(isType<ExprFunctionOverloadSet>(expression))
		assert(!"miscompiled tree");
	else if(isType<ExprShortFunctionOverloadSet>(expression))
		assert(!"miscompiled tree");
	else if(ExprFunctionCall *expr = getType<ExprFunctionCall>(expression))
		TranslateFunctionCall(ctx, expr);
	else if(ExprAliasDefinition *expr = getType<ExprAliasDefinition>(expression))
		TranslateAliasDefinition(ctx, expr);
	else if(ExprClassPrototype *expr = getType<ExprClassPrototype>(expression))
		TranslateClassPrototype(ctx, expr);
	else if(ExprGenericClassPrototype *expr = getType<ExprGenericClassPrototype>(expression))
		TranslateGenericClassPrototype(ctx, expr);
	else if(ExprClassDefinition *expr = getType<ExprClassDefinition>(expression))
		TranslateClassDefinition(ctx, expr);
	else if(ExprEnumDefinition *expr = getType<ExprEnumDefinition>(expression))
		TranslateEnumDefinition(ctx, expr);
	else if(ExprIfElse *expr = getType<ExprIfElse>(expression))
		TranslateIfElse(ctx, expr);
	else if(ExprFor *expr = getType<ExprFor>(expression))
		TranslateFor(ctx, expr);
	else if(ExprWhile *expr = getType<ExprWhile>(expression))
		TranslateWhile(ctx, expr);
	else if(ExprDoWhile *expr = getType<ExprDoWhile>(expression))
		TranslateDoWhile(ctx, expr);
	else if(ExprSwitch *expr = getType<ExprSwitch>(expression))
		TranslateSwitch(ctx, expr);
	else if(ExprBreak *expr = getType<ExprBreak>(expression))
		TranslateBreak(ctx, expr);
	else if(ExprContinue *expr = getType<ExprContinue>(expression))
		TranslateContinue(ctx, expr);
	else if(ExprBlock *expr = getType<ExprBlock>(expression))
		TranslateBlock(ctx, expr);
	else if(ExprSequence *expr = getType<ExprSequence>(expression))
		TranslateSequence(ctx, expr);
	else
		assert(!"unknown type");
}